

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O3

void __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::~Allocator
          (Allocator<mecab_node_t,_mecab_path_t> *this)

{
  ~Allocator(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Allocator() {}